

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

XMLLCPTranscoder * __thiscall
xercesc_4_0::ICUTransService::makeNewLCPTranscoder(ICUTransService *this,MemoryManager *manager)

{
  UConverter *toAdopt;
  ICULCPTranscoder *this_00;
  UConverter *converter;
  MemoryManager *pMStack_20;
  UErrorCode uerr;
  MemoryManager *manager_local;
  ICUTransService *this_local;
  
  converter._4_4_ = 0;
  pMStack_20 = manager;
  manager_local = (MemoryManager *)this;
  toAdopt = (UConverter *)ucnv_open_70(0,(long)&converter + 4);
  if (toAdopt == (UConverter *)0x0) {
    this_local = (ICUTransService *)0x0;
  }
  else {
    this_00 = (ICULCPTranscoder *)XMemory::operator_new(0x20,pMStack_20);
    ICULCPTranscoder::ICULCPTranscoder(this_00,toAdopt);
    this_local = (ICUTransService *)this_00;
  }
  return (XMLLCPTranscoder *)this_local;
}

Assistant:

XMLLCPTranscoder* ICUTransService::makeNewLCPTranscoder(MemoryManager* manager)
{
    //
    //  Try to create a default converter. If it fails, return a null
    //  pointer which will basically cause the system to give up because
    //  we really can't do anything without one.
    //
    UErrorCode uerr = U_ZERO_ERROR;
    UConverter* converter = ucnv_open(NULL, &uerr);
    if (!converter)
        return 0;

    // That went ok, so create an ICU LCP transcoder wrapper and return it
    return new (manager) ICULCPTranscoder(converter);
}